

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<long,unsigned_char,unsigned_char>
          (InternalException *this,string *msg,long params,uchar params_1,uchar params_2)

{
  undefined7 in_register_00000009;
  uchar in_R9B;
  string local_30;
  
  Exception::ConstructMessage<long,unsigned_char,unsigned_char>
            (&local_30,(Exception *)msg,(string *)params,CONCAT71(in_register_00000009,params_1),
             params_2,in_R9B);
  InternalException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}